

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmLineF<(moira::Instr)153,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  UInt16 local_2e;
  int local_2c;
  Int local_28;
  ushort local_22;
  u32 *puStack_20;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  SVar1 = str->style->syntax;
  local_22 = op;
  puStack_20 = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    pSVar2 = StrWriter::operator<<(str,".short ");
    Int::Int(&local_28,(uint)local_22);
    StrWriter::operator<<(pSVar2,local_28);
  }
  else {
    pSVar2 = StrWriter::operator<<(str,"dc.w ");
    local_2c = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_2c);
    UInt16::UInt16(&local_2e,local_22);
    pSVar2 = StrWriter::operator<<(pSVar2,local_2e);
    StrWriter::operator<<(pSVar2,"; opcode 1111");
  }
  return;
}

Assistant:

void
Moira::dasmLineF(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << ".short " << Int{op};
            break;

        default:

            str << "dc.w " << str.tab << UInt16{op} << "; opcode 1111";
    }
}